

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmcode.cpp
# Opt level: O0

opcode_table * assembler::anon_unknown_0::make_test_table(void)

{
  opcode_table *in_RDI;
  allocator<char> local_291;
  string local_290;
  opcode local_270;
  allocator<char> local_229;
  string local_228;
  opcode local_208;
  allocator<char> local_1c1;
  string local_1c0;
  opcode local_1a0;
  allocator<char> local_159;
  string local_158;
  opcode local_138;
  allocator<char> local_f1;
  string local_f0;
  opcode local_d0;
  allocator<char> local_79;
  string local_78;
  opcode local_58;
  undefined1 local_11;
  opcode_table *t;
  
  local_11 = 0;
  opcode_table::opcode_table(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"TEST",&local_79);
  make_opcode(&local_58,&local_78,0x1001,0xa9,rax,imm32);
  opcode_table::add_opcode(in_RDI,&local_58);
  opcode::~opcode(&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"TEST",&local_f1);
  make_opcode(&local_d0,&local_f0,0x1005,0xf7,rm64,imm32);
  opcode_table::add_opcode(in_RDI,&local_d0);
  opcode::~opcode(&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"TEST",&local_159);
  make_opcode(&local_138,&local_158,0x1004,0xf7,rm32,imm32);
  opcode_table::add_opcode(in_RDI,&local_138);
  opcode::~opcode(&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"TEST",&local_1c1);
  make_opcode(&local_1a0,&local_1c0,3,0x85,rm64,r64);
  opcode_table::add_opcode(in_RDI,&local_1a0);
  opcode::~opcode(&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"TEST",&local_229);
  make_opcode(&local_208,&local_228,2,0x84,rm8,r8);
  opcode_table::add_opcode(in_RDI,&local_208);
  opcode::~opcode(&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"TEST",&local_291);
  make_opcode(&local_270,&local_290,2,0x85,rm32,r32);
  opcode_table::add_opcode(in_RDI,&local_270);
  opcode::~opcode(&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator(&local_291);
  return in_RDI;
}

Assistant:

opcode_table make_test_table()
    {
    opcode_table t;

    t.add_opcode(make_opcode("TEST", opcode::rexw | opcode::id, 0xA9, opcode::rax, opcode::imm32));
    t.add_opcode(make_opcode("TEST", opcode::rexw | opcode::digit0 | opcode::id, 0xF7, opcode::rm64, opcode::imm32));    
    t.add_opcode(make_opcode("TEST", opcode::digit0 | opcode::id, 0xF7, opcode::rm32, opcode::imm32));

    t.add_opcode(make_opcode("TEST", opcode::rexw | opcode::r, 0x85, opcode::rm64, opcode::r64));

    t.add_opcode(make_opcode("TEST", opcode::r, 0x84, opcode::rm8, opcode::r8));

    //85 /r TEST r/m32, r32
    t.add_opcode(make_opcode("TEST", opcode::r, 0x85, opcode::rm32, opcode::r32));
    return t;
    }